

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O2

float3 tinyusdz::vnormalize(float3 *a,float eps)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float3 fVar4;
  
  fVar1 = vlength(a);
  if (fVar1 <= eps) {
    fVar1 = eps;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)a->_M_elems;
  fVar4._M_elems[2] = a->_M_elems[2] / fVar1;
  auVar3._4_4_ = fVar1;
  auVar3._0_4_ = fVar1;
  auVar3._8_4_ = fVar1;
  auVar3._12_4_ = fVar1;
  auVar3 = divps(auVar2,auVar3);
  fVar4._M_elems[0] = (float)(int)auVar3._0_8_;
  fVar4._M_elems[1] = (float)(int)((ulong)auVar3._0_8_ >> 0x20);
  return (float3)fVar4._M_elems;
}

Assistant:

value::float3 vnormalize(const value::float3 &a, const float eps) {
  float len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::float3({a[0] / len, a[1] / len, a[2] / len});
}